

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

QRegularExpressionMatch __thiscall
QRegularExpression::match
          (QRegularExpression *this,QString *subject,qsizetype offset,MatchType matchType,
          MatchOptions matchOptions)

{
  long lVar1;
  QStringView subject_00;
  QRegularExpressionMatchPrivate *this_00;
  QString *in_RDX;
  undefined8 in_RSI;
  QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> in_RDI;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  QRegularExpressionMatchPrivate *in_stack_00000028;
  QRegularExpressionMatchPrivate *priv;
  MatchType in_stack_ffffffffffffff7c;
  QRegularExpressionPrivate *in_stack_ffffffffffffff88;
  QFlagsStorage<QRegularExpression::MatchOption> matchOptions_00;
  QRegularExpressionMatchPrivate *pQVar2;
  qsizetype in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  CheckSubjectStringOption in_stack_ffffffffffffffe4;
  qsizetype in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar4;
  
  matchOptions_00.i = (Int)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QRegularExpressionMatchPrivate *)in_RDI.d.ptr;
  QExplicitlySharedDataPointer<QRegularExpressionPrivate>::data
            ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)0x1446a6);
  QRegularExpressionPrivate::compilePattern(in_stack_ffffffffffffff88);
  this_00 = (QRegularExpressionMatchPrivate *)operator_new(0x60);
  QStringView::QStringView<QString,_true>((QStringView *)this_00,in_RDX);
  subject_00.m_size = in_stack_ffffffffffffffa8;
  subject_00.m_data = (storage_type_conflict *)pQVar2;
  uVar3 = in_R9D;
  uVar4 = in_R9D;
  QRegularExpressionMatchPrivate::QRegularExpressionMatchPrivate
            (this_00,(QRegularExpression *)in_RDX,(QString *)in_RDI.d.ptr,subject_00,
             in_stack_ffffffffffffff7c,(MatchOptions)matchOptions_00.i);
  QExplicitlySharedDataPointer<QRegularExpressionPrivate>::operator->
            ((QExplicitlySharedDataPointer<QRegularExpressionPrivate> *)0x14471b);
  QRegularExpressionPrivate::doMatch
            ((QRegularExpressionPrivate *)CONCAT44(uVar4,in_stack_fffffffffffffff0),
             in_stack_00000028,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
             (QRegularExpressionMatchPrivate *)CONCAT44(uVar3,in_stack_ffffffffffffffd8));
  QRegularExpressionMatch::QRegularExpressionMatch
            ((QRegularExpressionMatch *)in_RDI.d.ptr,
             (QRegularExpressionMatchPrivate *)CONCAT44(in_stack_ffffffffffffff7c,in_R9D));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpressionMatch QRegularExpression::match(const QString &subject,
                                                  qsizetype offset,
                                                  MatchType matchType,
                                                  MatchOptions matchOptions) const
{
    d.data()->compilePattern();
    auto priv = new QRegularExpressionMatchPrivate(*this,
                                                   subject,
                                                   QStringView(subject),
                                                   matchType,
                                                   matchOptions);
    d->doMatch(priv, offset);
    return QRegularExpressionMatch(*priv);
}